

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8.h
# Opt level: O1

void ncnn::conv1x1s1_sgemm_transform_kernel_pack8_avx
               (Mat *kernel,Mat *weight_data_pack8,int num_input,int num_output)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  undefined4 *puVar8;
  int iVar9;
  long lVar10;
  undefined4 *puVar11;
  uint uVar12;
  undefined4 *puVar13;
  long lVar14;
  undefined4 *puVar15;
  long lVar16;
  undefined4 *puVar17;
  undefined4 *puVar18;
  undefined4 *puVar19;
  long lVar20;
  long lVar21;
  undefined4 *puVar22;
  long lVar23;
  undefined4 *puVar24;
  Mat weight_data_r2;
  undefined4 *local_228;
  undefined4 *local_220;
  long local_218;
  long local_210;
  long local_208;
  undefined4 *local_200;
  undefined4 *local_1f8;
  undefined4 *local_1f0;
  undefined4 *local_1e8;
  Mat local_78;
  
  Mat::reshape(&local_78,kernel,1,num_input,num_output,(Allocator *)0x0);
  iVar9 = num_input + 7;
  if (-1 < num_input) {
    iVar9 = num_input;
  }
  iVar6 = num_output + 7;
  if (-1 < num_output) {
    iVar6 = num_output;
  }
  Mat::create(weight_data_pack8,1,iVar9 >> 3,iVar6 >> 3,0x100,0x40,(Allocator *)0x0);
  if (7 < num_output) {
    lVar7 = (long)local_78.w;
    lVar3 = local_78.cstep * 7;
    lVar4 = local_78.cstep * local_78.elemsize;
    sVar1 = weight_data_pack8->elemsize;
    iVar9 = weight_data_pack8->w;
    lVar20 = local_78.elemsize * lVar7;
    local_1e8 = (undefined4 *)((long)weight_data_pack8->data + 0xfc);
    sVar2 = weight_data_pack8->cstep;
    local_1f0 = (undefined4 *)(lVar4 * 3 + (long)local_78.data);
    local_1f8 = (undefined4 *)((long)local_78.data + lVar4);
    local_200 = (undefined4 *)(lVar4 * 5 + (long)local_78.data);
    local_208 = 2;
    local_210 = 4;
    local_218 = 6;
    uVar12 = 0;
    local_220 = (undefined4 *)local_78.data;
    local_228 = (undefined4 *)local_78.data;
    do {
      if (7 < num_input) {
        lVar10 = (long)local_78.w;
        lVar16 = (long)local_78.w;
        lVar21 = local_78.cstep * local_208;
        lVar23 = local_78.cstep * local_210;
        lVar14 = local_78.cstep * local_218;
        lVar5 = 7;
        puVar8 = local_220;
        puVar11 = local_1e8;
        puVar13 = local_228;
        puVar15 = (undefined4 *)local_78.data;
        puVar17 = local_1f8;
        puVar18 = local_200;
        puVar19 = local_1f0;
        puVar22 = (undefined4 *)local_78.data;
        puVar24 = (undefined4 *)local_78.data;
        do {
          puVar11[-0x3f] = *puVar8;
          puVar11[-0x3e] = *puVar17;
          puVar11[-0x3d] = *(undefined4 *)((long)puVar24 + lVar21 * local_78.elemsize);
          puVar11[-0x3c] = *puVar19;
          puVar11[-0x3b] = *(undefined4 *)((long)puVar15 + lVar23 * local_78.elemsize);
          puVar11[-0x3a] = *puVar18;
          puVar11[-0x39] = *(undefined4 *)((long)puVar22 + lVar14 * local_78.elemsize);
          puVar11[-0x38] = *(undefined4 *)((long)puVar13 + lVar4 * 7);
          puVar11[-0x37] = *(undefined4 *)((long)puVar8 + lVar20);
          puVar11[-0x36] = *(undefined4 *)((long)puVar17 + lVar20);
          puVar11[-0x35] = *(undefined4 *)((long)puVar24 + (lVar21 + lVar10) * local_78.elemsize);
          puVar11[-0x34] = *(undefined4 *)((long)puVar19 + lVar20);
          puVar11[-0x33] = *(undefined4 *)((long)puVar15 + (lVar23 + lVar10) * local_78.elemsize);
          puVar11[-0x32] = *(undefined4 *)((long)puVar18 + lVar20);
          puVar11[-0x31] = *(undefined4 *)((long)puVar22 + (lVar14 + lVar16) * local_78.elemsize);
          puVar11[-0x30] = *(undefined4 *)((long)puVar13 + (lVar3 + lVar7) * local_78.elemsize);
          puVar11[-0x2f] = *(undefined4 *)((long)puVar8 + lVar20 * 2);
          puVar11[-0x2e] = *(undefined4 *)((long)puVar17 + lVar20 * 2);
          puVar11[-0x2d] =
               *(undefined4 *)((long)puVar24 + (lVar21 + lVar10 * 2) * local_78.elemsize);
          puVar11[-0x2c] = *(undefined4 *)((long)puVar19 + lVar20 * 2);
          puVar11[-0x2b] =
               *(undefined4 *)((long)puVar15 + (lVar23 + lVar10 * 2) * local_78.elemsize);
          puVar11[-0x2a] = *(undefined4 *)((long)puVar18 + lVar20 * 2);
          puVar11[-0x29] =
               *(undefined4 *)((long)puVar22 + (lVar14 + lVar16 * 2) * local_78.elemsize);
          puVar11[-0x28] = *(undefined4 *)((long)puVar13 + (lVar3 + lVar7 * 2) * local_78.elemsize);
          puVar11[-0x27] = *(undefined4 *)((long)puVar8 + lVar20 * 3);
          puVar11[-0x26] = *(undefined4 *)((long)puVar17 + lVar20 * 3);
          puVar11[-0x25] =
               *(undefined4 *)((long)puVar24 + (lVar21 + lVar10 * 3) * local_78.elemsize);
          puVar11[-0x24] = *(undefined4 *)((long)puVar19 + lVar20 * 3);
          puVar11[-0x23] =
               *(undefined4 *)((long)puVar15 + (lVar23 + lVar10 * 3) * local_78.elemsize);
          puVar11[-0x22] = *(undefined4 *)((long)puVar18 + lVar20 * 3);
          puVar11[-0x21] =
               *(undefined4 *)((long)puVar22 + (lVar14 + lVar16 * 3) * local_78.elemsize);
          puVar11[-0x20] = *(undefined4 *)((long)puVar13 + (lVar3 + lVar7 * 3) * local_78.elemsize);
          puVar11[-0x1f] = puVar8[lVar20];
          puVar11[-0x1e] = puVar17[lVar20];
          puVar11[-0x1d] =
               *(undefined4 *)((long)puVar24 + (lVar21 + lVar10 * 4) * local_78.elemsize);
          puVar11[-0x1c] = puVar19[lVar20];
          puVar11[-0x1b] =
               *(undefined4 *)((long)puVar15 + (lVar23 + lVar10 * 4) * local_78.elemsize);
          puVar11[-0x1a] = puVar18[lVar20];
          puVar11[-0x19] =
               *(undefined4 *)((long)puVar22 + (lVar14 + lVar16 * 4) * local_78.elemsize);
          puVar11[-0x18] = *(undefined4 *)((long)puVar13 + (lVar3 + lVar7 * 4) * local_78.elemsize);
          puVar11[-0x17] = *(undefined4 *)((long)puVar8 + lVar20 * 5);
          puVar11[-0x16] = *(undefined4 *)((long)puVar17 + lVar20 * 5);
          puVar11[-0x15] =
               *(undefined4 *)((long)puVar24 + (lVar21 + lVar10 * 5) * local_78.elemsize);
          puVar11[-0x14] = *(undefined4 *)((long)puVar19 + lVar20 * 5);
          puVar11[-0x13] =
               *(undefined4 *)((long)puVar15 + (lVar10 * 5 + lVar23) * local_78.elemsize);
          puVar11[-0x12] = *(undefined4 *)((long)puVar18 + lVar20 * 5);
          puVar11[-0x11] =
               *(undefined4 *)((long)puVar22 + (lVar16 * 5 + lVar14) * local_78.elemsize);
          puVar11[-0x10] = *(undefined4 *)((long)puVar13 + (lVar7 * 5 + lVar3) * local_78.elemsize);
          puVar11[-0xf] = *(undefined4 *)((long)puVar8 + lVar20 * 6);
          puVar11[-0xe] = *(undefined4 *)((long)puVar17 + lVar20 * 6);
          puVar11[-0xd] = *(undefined4 *)((long)puVar24 + (lVar21 + lVar10 * 6) * local_78.elemsize)
          ;
          puVar11[-0xc] = *(undefined4 *)((long)puVar19 + lVar20 * 6);
          puVar11[-0xb] = *(undefined4 *)((long)puVar15 + (lVar23 + lVar10 * 6) * local_78.elemsize)
          ;
          puVar11[-10] = *(undefined4 *)((long)puVar18 + lVar20 * 6);
          puVar11[-9] = *(undefined4 *)((long)puVar22 + (lVar14 + lVar16 * 6) * local_78.elemsize);
          puVar11[-8] = *(undefined4 *)((long)puVar13 + (lVar3 + lVar7 * 6) * local_78.elemsize);
          puVar11[-7] = *(undefined4 *)((long)puVar8 + lVar20 * 7);
          puVar11[-6] = *(undefined4 *)((long)puVar17 + lVar20 * 7);
          puVar11[-5] = *(undefined4 *)((long)puVar24 + (lVar21 + lVar10 * 7) * local_78.elemsize);
          puVar11[-4] = *(undefined4 *)((long)puVar19 + lVar20 * 7);
          puVar11[-3] = *(undefined4 *)((long)puVar15 + (lVar10 * 7 + lVar23) * local_78.elemsize);
          puVar11[-2] = *(undefined4 *)((long)puVar18 + lVar20 * 7);
          puVar11[-1] = *(undefined4 *)((long)puVar22 + (lVar16 * 7 + lVar14) * local_78.elemsize);
          *puVar11 = *(undefined4 *)((long)puVar13 + (lVar7 * 7 + lVar3) * local_78.elemsize);
          puVar24 = puVar24 + local_78.elemsize * lVar10 * 2;
          puVar15 = puVar15 + local_78.elemsize * lVar10 * 2;
          puVar22 = puVar22 + local_78.elemsize * lVar16 * 2;
          puVar13 = puVar13 + lVar20 * 2;
          puVar11 = (undefined4 *)((long)puVar11 + (long)iVar9 * sVar1);
          puVar8 = puVar8 + lVar20 * 2;
          puVar17 = puVar17 + lVar20 * 2;
          puVar19 = puVar19 + lVar20 * 2;
          puVar18 = puVar18 + lVar20 * 2;
          lVar5 = lVar5 + 8;
        } while (lVar5 < num_input);
      }
      uVar12 = uVar12 + 8;
      local_208 = local_208 + 8;
      local_210 = local_210 + 8;
      local_218 = local_218 + 8;
      local_228 = local_228 + lVar4 * 2;
      local_1e8 = (undefined4 *)((long)local_1e8 + sVar2 * sVar1);
      local_220 = local_220 + lVar4 * 2;
      local_1f8 = local_1f8 + lVar4 * 2;
      local_1f0 = local_1f0 + lVar4 * 2;
      local_200 = local_200 + lVar4 * 2;
    } while ((int)(uVar12 | 7) < num_output);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_78.data != (undefined4 *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s1_sgemm_transform_kernel_pack8_avx(const Mat& kernel, Mat& weight_data_pack8, int num_input, int num_output)
{
    // src = kw-kh-inch-outch
    // dst = 8b-8a-kw-kh-inch/8a-outch/8b
    Mat weight_data_r2 = kernel.reshape(1, num_input, num_output);

    weight_data_pack8.create(1, num_input / 8, num_output / 8, (size_t)4 * 64, 64);

    for (int q = 0; q + 7 < num_output; q += 8)
    {
        const Mat k0 = weight_data_r2.channel(q);
        const Mat k1 = weight_data_r2.channel(q + 1);
        const Mat k2 = weight_data_r2.channel(q + 2);
        const Mat k3 = weight_data_r2.channel(q + 3);
        const Mat k4 = weight_data_r2.channel(q + 4);
        const Mat k5 = weight_data_r2.channel(q + 5);
        const Mat k6 = weight_data_r2.channel(q + 6);
        const Mat k7 = weight_data_r2.channel(q + 7);

        Mat g0 = weight_data_pack8.channel(q / 8);

        for (int p = 0; p + 7 < num_input; p += 8)
        {
            const float* k00 = k0.row(p);
            const float* k01 = k0.row(p + 1);
            const float* k02 = k0.row(p + 2);
            const float* k03 = k0.row(p + 3);
            const float* k04 = k0.row(p + 4);
            const float* k05 = k0.row(p + 5);
            const float* k06 = k0.row(p + 6);
            const float* k07 = k0.row(p + 7);

            const float* k10 = k1.row(p);
            const float* k11 = k1.row(p + 1);
            const float* k12 = k1.row(p + 2);
            const float* k13 = k1.row(p + 3);
            const float* k14 = k1.row(p + 4);
            const float* k15 = k1.row(p + 5);
            const float* k16 = k1.row(p + 6);
            const float* k17 = k1.row(p + 7);

            const float* k20 = k2.row(p);
            const float* k21 = k2.row(p + 1);
            const float* k22 = k2.row(p + 2);
            const float* k23 = k2.row(p + 3);
            const float* k24 = k2.row(p + 4);
            const float* k25 = k2.row(p + 5);
            const float* k26 = k2.row(p + 6);
            const float* k27 = k2.row(p + 7);

            const float* k30 = k3.row(p);
            const float* k31 = k3.row(p + 1);
            const float* k32 = k3.row(p + 2);
            const float* k33 = k3.row(p + 3);
            const float* k34 = k3.row(p + 4);
            const float* k35 = k3.row(p + 5);
            const float* k36 = k3.row(p + 6);
            const float* k37 = k3.row(p + 7);

            const float* k40 = k4.row(p);
            const float* k41 = k4.row(p + 1);
            const float* k42 = k4.row(p + 2);
            const float* k43 = k4.row(p + 3);
            const float* k44 = k4.row(p + 4);
            const float* k45 = k4.row(p + 5);
            const float* k46 = k4.row(p + 6);
            const float* k47 = k4.row(p + 7);

            const float* k50 = k5.row(p);
            const float* k51 = k5.row(p + 1);
            const float* k52 = k5.row(p + 2);
            const float* k53 = k5.row(p + 3);
            const float* k54 = k5.row(p + 4);
            const float* k55 = k5.row(p + 5);
            const float* k56 = k5.row(p + 6);
            const float* k57 = k5.row(p + 7);

            const float* k60 = k6.row(p);
            const float* k61 = k6.row(p + 1);
            const float* k62 = k6.row(p + 2);
            const float* k63 = k6.row(p + 3);
            const float* k64 = k6.row(p + 4);
            const float* k65 = k6.row(p + 5);
            const float* k66 = k6.row(p + 6);
            const float* k67 = k6.row(p + 7);

            const float* k70 = k7.row(p);
            const float* k71 = k7.row(p + 1);
            const float* k72 = k7.row(p + 2);
            const float* k73 = k7.row(p + 3);
            const float* k74 = k7.row(p + 4);
            const float* k75 = k7.row(p + 5);
            const float* k76 = k7.row(p + 6);
            const float* k77 = k7.row(p + 7);

            float* g00 = g0.row(p / 8);
            g00[0] = k00[0];
            g00[1] = k10[0];
            g00[2] = k20[0];
            g00[3] = k30[0];
            g00[4] = k40[0];
            g00[5] = k50[0];
            g00[6] = k60[0];
            g00[7] = k70[0];
            g00 += 8;
            g00[0] = k01[0];
            g00[1] = k11[0];
            g00[2] = k21[0];
            g00[3] = k31[0];
            g00[4] = k41[0];
            g00[5] = k51[0];
            g00[6] = k61[0];
            g00[7] = k71[0];

            g00 += 8;
            g00[0] = k02[0];
            g00[1] = k12[0];
            g00[2] = k22[0];
            g00[3] = k32[0];
            g00[4] = k42[0];
            g00[5] = k52[0];
            g00[6] = k62[0];
            g00[7] = k72[0];

            g00 += 8;
            g00[0] = k03[0];
            g00[1] = k13[0];
            g00[2] = k23[0];
            g00[3] = k33[0];
            g00[4] = k43[0];
            g00[5] = k53[0];
            g00[6] = k63[0];
            g00[7] = k73[0];

            g00 += 8;
            g00[0] = k04[0];
            g00[1] = k14[0];
            g00[2] = k24[0];
            g00[3] = k34[0];
            g00[4] = k44[0];
            g00[5] = k54[0];
            g00[6] = k64[0];
            g00[7] = k74[0];

            g00 += 8;
            g00[0] = k05[0];
            g00[1] = k15[0];
            g00[2] = k25[0];
            g00[3] = k35[0];
            g00[4] = k45[0];
            g00[5] = k55[0];
            g00[6] = k65[0];
            g00[7] = k75[0];

            g00 += 8;
            g00[0] = k06[0];
            g00[1] = k16[0];
            g00[2] = k26[0];
            g00[3] = k36[0];
            g00[4] = k46[0];
            g00[5] = k56[0];
            g00[6] = k66[0];
            g00[7] = k76[0];

            g00 += 8;
            g00[0] = k07[0];
            g00[1] = k17[0];
            g00[2] = k27[0];
            g00[3] = k37[0];
            g00[4] = k47[0];
            g00[5] = k57[0];
            g00[6] = k67[0];
            g00[7] = k77[0];

            g00 += 8;
        }
    }
}